

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfdcapi_elements_transaction_GetTransactionData_Test::TestBody
          (cfdcapi_elements_transaction_GetTransactionData_Test *this)

{
  bool bVar1;
  char *in_R9;
  char *pcVar2;
  char *asset_value;
  uint32_t weight;
  char *wtxid;
  char *wit_hash;
  char *token_value;
  uint32_t vsize;
  AssertionResult gtest_ar;
  int ret;
  uint32_t version;
  char *script_sig;
  char *txid;
  void *handle;
  uint32_t size;
  uint32_t sequence;
  uint32_t vout;
  uint32_t txout_count;
  uint32_t locktime;
  uint32_t txin_count;
  AssertHelper local_c0;
  AssertHelper local_b8;
  AssertHelper local_b0;
  AssertHelper local_a8;
  AssertHelper local_a0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  string local_90;
  int local_6c;
  AssertHelper local_68;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  void *local_48;
  char *local_40;
  uint32_t local_34 [5];
  
  local_48 = (void *)0x0;
  local_6c = CfdCreateHandle(&local_48);
  local_58.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_58.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_90,"kCfdSuccess","ret",(CfdErrorCode *)&local_58,&local_6c);
  if ((char)local_90._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_90._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x171,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.ptr_._0_1_ = local_48 != (void *)0x0;
  local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48 == (void *)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)&local_58,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x172,(char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,
                                       (char)local_90._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p));
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_34[4] = 0;
  local_34[2] = 0;
  local_6c = CfdGetConfidentialTxInCount
                       (local_48,
                        "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                        ,local_34 + 4);
  local_58.ptr_ = local_58.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_90,"kCfdSuccess","ret",(CfdErrorCode *)&local_58,&local_6c);
  if ((char)local_90._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_90._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x17a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_90,"2","txin_count",(int *)&local_58,local_34 + 4);
  if ((char)local_90._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_90._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x17b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_6c = CfdGetConfidentialTxOutCount
                       (local_48,
                        "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                        ,local_34 + 2);
  local_58.ptr_ = local_58.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_90,"kCfdSuccess","ret",(CfdErrorCode *)&local_58,&local_6c);
  if ((char)local_90._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_90._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x17e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.ptr_._0_4_ = 4;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_90,"4","txout_count",(int *)&local_58,local_34 + 2);
  if ((char)local_90._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_90._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x17f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_60.data_ = (AssertHelperData *)0x0;
  local_34[1] = 0;
  local_34[0] = 0;
  if (local_6c == 0) {
    local_b0.data_ = (AssertHelperData *)0x0;
    local_a8.data_ = (AssertHelperData *)0x0;
    local_40 = (char *)((ulong)local_40 & 0xffffffff00000000);
    local_98.ptr_ = local_98.ptr_ & 0xffffffff00000000;
    local_b8.data_._0_4_ = 0;
    local_68.data_._0_4_ = 0;
    local_34[3] = 0;
    local_6c = CfdGetConfidentialTxInfo
                         (local_48,
                          "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                          ,(char **)&local_58,(char **)&local_b0,(char **)&local_a8,
                          (uint32_t *)&local_40,(uint32_t *)&local_98,(uint32_t *)&local_b8,
                          (uint32_t *)&local_68,local_34 + 3);
    local_c0.data_ = local_c0.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_90,"kCfdSuccess","ret",(CfdErrorCode *)&local_c0,&local_6c);
    if ((char)local_90._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_c0);
      if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_90._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,400,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_c0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_c0.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_90._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_6c == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_90,
                 "\"cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992\"","txid",
                 "cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992",
                 (char *)local_58.ptr_);
      if ((char)local_90._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c0);
        if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_90._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x192,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (local_c0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_90._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_90,
                 "\"cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992\"","wtxid",
                 "cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992",
                 (char *)local_b0.data_);
      if ((char)local_90._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c0);
        if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_90._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x193,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (local_c0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_90._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_90,
                 "\"938e3a9b5bac410e812d08db74c4ef2bc58d1ed99d94b637cab0ac2e9eb59df8\"","wit_hash",
                 "938e3a9b5bac410e812d08db74c4ef2bc58d1ed99d94b637cab0ac2e9eb59df8",
                 (char *)local_a8.data_);
      if ((char)local_90._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c0);
        if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_90._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x194,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (local_c0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_90._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_c0.data_._0_4_ = 0x200;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_90,"512","size",(int *)&local_c0,(uint *)&local_40);
      if ((char)local_90._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c0);
        if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_90._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x195,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (local_c0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_90._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_c0.data_._0_4_ = 0x200;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_90,"512","vsize",(int *)&local_c0,(uint *)&local_98);
      if ((char)local_90._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c0);
        if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_90._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x196,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (local_c0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_90._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_c0.data_._0_4_ = 0x800;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_90,"2048","weight",(int *)&local_c0,(uint *)&local_b8);
      if ((char)local_90._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c0);
        if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_90._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x197,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (local_c0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_90._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_c0.data_._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_90,"2","version",(int *)&local_c0,(uint *)&local_68);
      if ((char)local_90._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c0);
        if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_90._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x198,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (local_c0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_90._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_c0.data_ = local_c0.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_90,"0","locktime",(int *)&local_c0,local_34 + 3);
      if ((char)local_90._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_c0);
        if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_90._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x199,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (local_c0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_c0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_c0.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_90._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_58.ptr_);
      CfdFreeStringBuffer((char *)local_b0.data_);
      CfdFreeStringBuffer((char *)local_a8.data_);
      local_58.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
      if (local_6c == 0) {
        local_6c = CfdGetConfidentialTxIn
                             (local_48,
                              "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                              ,1,(char **)&local_58,local_34 + 1,local_34,(char **)&local_60);
        local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_90,"kCfdSuccess","ret",(CfdErrorCode *)&local_b0,&local_6c);
        if ((char)local_90._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_b0);
          if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_90._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x1a4,pcVar2);
          testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
          testing::internal::AssertHelper::~AssertHelper(&local_a8);
          if (local_b0.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_b0.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_90._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (local_6c == 0) {
          testing::internal::CmpHelperSTREQ
                    ((internal *)&local_90,
                     "\"57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f\"","txid",
                     "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",
                     (char *)local_58.ptr_);
          if ((char)local_90._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_b0);
            if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)local_90._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                       ,0x1a6,pcVar2);
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
            testing::internal::AssertHelper::~AssertHelper(&local_a8);
            if (local_b0.data_ != (AssertHelperData *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_b0.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          local_b0.data_._0_4_ = 1;
          testing::internal::CmpHelperEQ<int,unsigned_int>
                    ((internal *)&local_90,"1","vout",(int *)&local_b0,local_34 + 1);
          if ((char)local_90._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_b0);
            if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)local_90._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                       ,0x1a7,pcVar2);
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
            testing::internal::AssertHelper::~AssertHelper(&local_a8);
            if (local_b0.data_ != (AssertHelperData *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_b0.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          pcVar2 = "";
          testing::internal::CmpHelperSTREQ
                    ((internal *)&local_90,"\"\"","script_sig","",(char *)local_60.data_);
          if ((char)local_90._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_b0);
            if ((undefined8 *)local_90._M_string_length != (undefined8 *)0x0) {
              pcVar2 = *(char **)local_90._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                       ,0x1a8,pcVar2);
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
            testing::internal::AssertHelper::~AssertHelper(&local_a8);
            if (local_b0.data_ != (AssertHelperData *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_b0.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          local_b0.data_._0_4_ = 0xffffffff;
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                    ((internal *)&local_90,"4294967295U","sequence",(uint *)&local_b0,local_34);
          if ((char)local_90._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_b0);
            if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)local_90._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                       ,0x1a9,pcVar2);
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
            testing::internal::AssertHelper::~AssertHelper(&local_a8);
            if (local_b0.data_ != (AssertHelperData *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_b0.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          CfdFreeStringBuffer((char *)local_58.ptr_);
          CfdFreeStringBuffer((char *)local_60.data_);
          local_58.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_60.data_ = (AssertHelperData *)0x0;
          if (local_6c == 0) {
            local_b0.data_ = (AssertHelperData *)0x0;
            local_a8.data_ = (AssertHelperData *)0x0;
            local_c0.data_ = (AssertHelperData *)0x0;
            local_a0.data_ = (AssertHelperData *)0x0;
            local_40 = (char *)0x0;
            local_98.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_6c = CfdGetTxInIssuanceInfo
                                 (local_48,
                                  "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                                  ,1,(char **)&local_b0,(char **)&local_a8,(int64_t *)&local_40,
                                  (char **)&local_c0,(int64_t *)&local_98,(char **)&local_a0,
                                  (char **)0x0,(char **)0x0);
            local_b8.data_._0_4_ = 0;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&local_90,"kCfdSuccess","ret",(CfdErrorCode *)&local_b8,&local_6c
                      );
            if ((char)local_90._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_b8);
              if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = *(char **)local_90._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_68,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                         ,0x1bb,pcVar2);
              testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_b8);
              testing::internal::AssertHelper::~AssertHelper(&local_68);
              if (CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != 0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) &&
                   ((long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != (long *)0x0)) {
                  (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_90._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            if (local_6c == 0) {
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_90,
                         "\"6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306\"",
                         "entropy",
                         "6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306",
                         (char *)local_b0.data_);
              if ((char)local_90._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_b8);
                if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = *(char **)local_90._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_68,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                           ,0x1bd,pcVar2);
                testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_b8);
                testing::internal::AssertHelper::~AssertHelper(&local_68);
                if (CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != 0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) &&
                     ((long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != (long *)0x0)) {
                    (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) + 8))
                              ();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_90._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_90,
                         "\"0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8\"",
                         "nonce","0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8",
                         (char *)local_a8.data_);
              if ((char)local_90._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_b8);
                if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = *(char **)local_90._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_68,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                           ,0x1be,pcVar2);
                testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_b8);
                testing::internal::AssertHelper::~AssertHelper(&local_68);
                if (CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != 0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) &&
                     ((long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != (long *)0x0)) {
                    (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) + 8))
                              ();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_90._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_90,"\"010000000023c34600\"","asset_value",
                         "010000000023c34600",(char *)local_c0.data_);
              if ((char)local_90._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_b8);
                if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = *(char **)local_90._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_68,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                           ,0x1bf,pcVar2);
                testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_b8);
                testing::internal::AssertHelper::~AssertHelper(&local_68);
                if (CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != 0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) &&
                     ((long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != (long *)0x0)) {
                    (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) + 8))
                              ();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_90._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              pcVar2 = "";
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_90,"\"\"","token_value","",(char *)local_a0.data_);
              if ((char)local_90._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_b8);
                if ((undefined8 *)local_90._M_string_length != (undefined8 *)0x0) {
                  pcVar2 = *(char **)local_90._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_68,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                           ,0x1c0,pcVar2);
                testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_b8);
                testing::internal::AssertHelper::~AssertHelper(&local_68);
                if (CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != 0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) &&
                     ((long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != (long *)0x0)) {
                    (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) + 8))
                              ();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_90._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              local_b8.data_._0_4_ = 600000000;
              testing::internal::CmpHelperEQ<int,long>
                        ((internal *)&local_90,"600000000","asset_amount",(int *)&local_b8,
                         (long *)&local_40);
              if ((char)local_90._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_b8);
                if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = *(char **)local_90._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_68,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                           ,0x1c1,pcVar2);
                testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_b8);
                testing::internal::AssertHelper::~AssertHelper(&local_68);
                if (CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != 0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) &&
                     ((long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != (long *)0x0)) {
                    (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) + 8))
                              ();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_90._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              local_b8.data_._0_4_ = 0;
              testing::internal::CmpHelperEQ<int,long>
                        ((internal *)&local_90,"0","token_amount",(int *)&local_b8,(long *)&local_98
                        );
              if ((char)local_90._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_b8);
                if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = *(char **)local_90._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_68,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                           ,0x1c2,pcVar2);
                testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_b8);
                testing::internal::AssertHelper::~AssertHelper(&local_68);
                if (CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != 0) {
                  bVar1 = testing::internal::IsTrue(true);
                  if ((bVar1) &&
                     ((long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) != (long *)0x0)) {
                    (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) + 8))
                              ();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_90._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              CfdFreeStringBuffer((char *)local_b0.data_);
              CfdFreeStringBuffer((char *)local_a8.data_);
              CfdFreeStringBuffer((char *)local_c0.data_);
              CfdFreeStringBuffer((char *)local_a0.data_);
              if (local_6c == 0) {
                local_b0.data_ = (AssertHelperData *)0x0;
                local_a8.data_ = (AssertHelperData *)0x0;
                local_c0.data_ = (AssertHelperData *)0x0;
                local_a0.data_ = (AssertHelperData *)0x0;
                local_40 = (char *)0x0;
                local_6c = CfdGetConfidentialTxOut
                                     (local_48,
                                      "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                                      ,3,(char **)&local_b0,(int64_t *)&local_a8,(char **)&local_c0,
                                      (char **)&local_a0,&local_40,(char **)0x0,(char **)0x0);
                local_98.ptr_ = local_98.ptr_ & 0xffffffff00000000;
                testing::internal::CmpHelperEQ<CfdErrorCode,int>
                          ((internal *)&local_90,"kCfdSuccess","ret",(CfdErrorCode *)&local_98,
                           &local_6c);
                if ((char)local_90._M_dataplus._M_p == '\0') {
                  testing::Message::Message((Message *)&local_98);
                  if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = *(char **)local_90._M_string_length;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_b8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                             ,0x1d4,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_98);
                  testing::internal::AssertHelper::~AssertHelper(&local_b8);
                  if (local_98.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    bVar1 = testing::internal::IsTrue(true);
                    if ((bVar1) &&
                       (local_98.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0)) {
                      (**(code **)(*(long *)local_98.ptr_ + 8))();
                    }
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_90._M_string_length,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                if (local_6c == 0) {
                  testing::internal::CmpHelperSTREQ
                            ((internal *)&local_90,
                             "\"accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd\"",
                             "asset_string",
                             "accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd",
                             (char *)local_b0.data_);
                  if ((char)local_90._M_dataplus._M_p == '\0') {
                    testing::Message::Message((Message *)&local_98);
                    if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = *(char **)local_90._M_string_length;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_b8,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                               ,0x1d6,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_b8);
                    if (local_98.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      bVar1 = testing::internal::IsTrue(true);
                      if ((bVar1) &&
                         (local_98.ptr_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0)) {
                        (**(code **)(*(long *)local_98.ptr_ + 8))();
                      }
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_90._M_string_length,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperSTREQ
                            ((internal *)&local_90,"\"010000000023c34600\"","value_commitment",
                             "010000000023c34600",(char *)local_c0.data_);
                  if ((char)local_90._M_dataplus._M_p == '\0') {
                    testing::Message::Message((Message *)&local_98);
                    if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = *(char **)local_90._M_string_length;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_b8,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                               ,0x1d7,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_b8);
                    if (local_98.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      bVar1 = testing::internal::IsTrue(true);
                      if ((bVar1) &&
                         (local_98.ptr_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0)) {
                        (**(code **)(*(long *)local_98.ptr_ + 8))();
                      }
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_90._M_string_length,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperSTREQ
                            ((internal *)&local_90,
                             "\"03ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed879\""
                             ,"nonce",
                             "03ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed879",
                             (char *)local_a0.data_);
                  if ((char)local_90._M_dataplus._M_p == '\0') {
                    testing::Message::Message((Message *)&local_98);
                    if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = *(char **)local_90._M_string_length;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_b8,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                               ,0x1d8,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_b8);
                    if (local_98.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      bVar1 = testing::internal::IsTrue(true);
                      if ((bVar1) &&
                         (local_98.ptr_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0)) {
                        (**(code **)(*(long *)local_98.ptr_ + 8))();
                      }
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_90._M_string_length,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  testing::internal::CmpHelperSTREQ
                            ((internal *)&local_90,
                             "\"76a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac\"",
                             "locking_script","76a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac",
                             local_40);
                  if ((char)local_90._M_dataplus._M_p == '\0') {
                    testing::Message::Message((Message *)&local_98);
                    if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = *(char **)local_90._M_string_length;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_b8,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                               ,0x1d9,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_b8);
                    if (local_98.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      bVar1 = testing::internal::IsTrue(true);
                      if ((bVar1) &&
                         (local_98.ptr_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0)) {
                        (**(code **)(*(long *)local_98.ptr_ + 8))();
                      }
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_90._M_string_length,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  local_98.ptr_._0_4_ = 600000000;
                  testing::internal::CmpHelperEQ<int,long>
                            ((internal *)&local_90,"600000000","value_satoshi",(int *)&local_98,
                             (long *)&local_a8);
                  if ((char)local_90._M_dataplus._M_p == '\0') {
                    testing::Message::Message((Message *)&local_98);
                    if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = *(char **)local_90._M_string_length;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_b8,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                               ,0x1da,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_98);
                    testing::internal::AssertHelper::~AssertHelper(&local_b8);
                    if (local_98.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      bVar1 = testing::internal::IsTrue(true);
                      if ((bVar1) &&
                         (local_98.ptr_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0)) {
                        (**(code **)(*(long *)local_98.ptr_ + 8))();
                      }
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_90._M_string_length,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  CfdFreeStringBuffer((char *)local_b0.data_);
                  CfdFreeStringBuffer((char *)local_c0.data_);
                  CfdFreeStringBuffer((char *)local_a0.data_);
                  CfdFreeStringBuffer(local_40);
                }
              }
            }
          }
        }
      }
    }
  }
  local_6c = CfdGetLastErrorCode(local_48);
  if (local_6c != 0) {
    local_b0.data_ = (AssertHelperData *)0x0;
    local_6c = CfdGetLastErrorMessage(local_48,(char **)&local_b0);
    local_a8.data_ = local_a8.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_90,"kCfdSuccess","ret",(CfdErrorCode *)&local_a8,&local_6c);
    if ((char)local_90._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_a8);
      if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_90._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x1e7,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (local_a8.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_a8.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_a8.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_90._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_90,"\"\"","str_buffer","",(char *)local_b0.data_);
    if ((char)local_90._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_a8);
      if ((undefined8 *)local_90._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_90._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x1e8,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (local_a8.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_a8.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_a8.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_90._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)local_b0.data_);
  }
  local_6c = CfdFreeHandle(local_48);
  local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_90,"kCfdSuccess","ret",(CfdErrorCode *)&local_b0,&local_6c);
  if ((char)local_90._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_90._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x1ee,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_b0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, GetTransactionData) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  static const char* tx_data = "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000";

  uint32_t txin_count = 0;
  uint32_t txout_count = 0;

  ret = CfdGetConfidentialTxInCount(handle, tx_data, &txin_count);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_EQ(2, txin_count);

  ret = CfdGetConfidentialTxOutCount(handle, tx_data, &txout_count);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_EQ(4, txout_count);

  char* txid = nullptr;
  char* script_sig = nullptr;
  uint32_t vout = 0;
  uint32_t sequence = 0;
  if (ret == kCfdSuccess) {
    char* wtxid = nullptr;
    char* wit_hash = nullptr;
    uint32_t size = 0;
    uint32_t vsize = 0;
    uint32_t weight = 0;
    uint32_t version = 0;
    uint32_t locktime = 0;
    ret = CfdGetConfidentialTxInfo(
        handle, tx_data, &txid, &wtxid, &wit_hash, &size, &vsize, &weight,
        &version, &locktime);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992", txid);
      EXPECT_STREQ("cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992", wtxid);
      EXPECT_STREQ("938e3a9b5bac410e812d08db74c4ef2bc58d1ed99d94b637cab0ac2e9eb59df8", wit_hash);
      EXPECT_EQ(512, size);
      EXPECT_EQ(512, vsize);
      EXPECT_EQ(2048, weight);
      EXPECT_EQ(2, version);
      EXPECT_EQ(0, locktime);

      CfdFreeStringBuffer(txid);
      CfdFreeStringBuffer(wtxid);
      CfdFreeStringBuffer(wit_hash);
      txid = nullptr;
    }
  }
  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxIn(
        handle, tx_data, 1, &txid, &vout, &sequence, &script_sig);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", txid);
      EXPECT_EQ(1, vout);
      EXPECT_STREQ("", script_sig);
      EXPECT_EQ(4294967295U, sequence);

      CfdFreeStringBuffer(txid);
      CfdFreeStringBuffer(script_sig);
      txid = nullptr;
      script_sig = nullptr;
    }
  }
  if (ret == kCfdSuccess) {
    char* entropy = nullptr;
    char* nonce = nullptr;
    char* asset_value = nullptr;
    char* token_value = nullptr;
    int64_t asset_amount = 0;
    int64_t token_amount = 0;
    ret = CfdGetTxInIssuanceInfo(
        handle, tx_data, 1, &entropy, &nonce, &asset_amount, &asset_value,
        &token_amount, &token_value, nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306", entropy);
      EXPECT_STREQ("0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8", nonce);
      EXPECT_STREQ("010000000023c34600", asset_value);
      EXPECT_STREQ("", token_value);
      EXPECT_EQ(600000000, asset_amount);
      EXPECT_EQ(0, token_amount);

      CfdFreeStringBuffer(entropy);
      CfdFreeStringBuffer(nonce);
      CfdFreeStringBuffer(asset_value);
      CfdFreeStringBuffer(token_value);
    }
  }

  if (ret == kCfdSuccess) {
    char* asset_string = nullptr;
    int64_t value_satoshi = 0;
    char* value_commitment = nullptr;
    char* nonce = nullptr;
    char* locking_script = nullptr;
    ret = CfdGetConfidentialTxOut(
        handle, tx_data, 3, &asset_string, &value_satoshi, &value_commitment,
        &nonce, &locking_script, nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd", asset_string);
      EXPECT_STREQ("010000000023c34600", value_commitment);
      EXPECT_STREQ("03ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed879", nonce);
      EXPECT_STREQ("76a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac", locking_script);
      EXPECT_EQ(600000000, value_satoshi);

      CfdFreeStringBuffer(asset_string);
      CfdFreeStringBuffer(value_commitment);
      CfdFreeStringBuffer(nonce);
      CfdFreeStringBuffer(locking_script);
    }
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}